

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * fmt::v5::internal::
       format_decimal<unsigned_long,char,fmt::v5::internal::add_thousands_sep<char>>
                 (char *buffer,unsigned_long value,uint num_digits,
                 add_thousands_sep<char> thousands_sep)

{
  char cVar1;
  byte bVar2;
  char *local_40;
  char *local_38;
  
  local_40 = buffer + num_digits;
  local_38 = local_40;
  for (; 99 < value; value = value / 100) {
    cVar1 = basic_data<void>::DIGITS[(value % 100) * 2];
    local_40[-1] = basic_data<void>::DIGITS[(value % 100) * 2 + 1];
    local_40 = local_40 + -1;
    add_thousands_sep<char>::operator()(&thousands_sep,&local_40);
    local_40[-1] = cVar1;
    local_40 = local_40 + -1;
    add_thousands_sep<char>::operator()(&thousands_sep,&local_40);
  }
  if (value < 10) {
    bVar2 = (byte)value | 0x30;
  }
  else {
    local_40[-1] = basic_data<void>::DIGITS[(value * 2 & 0xffffffff) + 1];
    local_40 = local_40 + -1;
    add_thousands_sep<char>::operator()(&thousands_sep,&local_40);
    bVar2 = basic_data<void>::DIGITS[value * 2 & 0x1fffffffe];
  }
  local_40[-1] = bVar2;
  return local_38;
}

Assistant:

inline Char *format_decimal(Char *buffer, UInt value, unsigned num_digits,
                            ThousandsSep thousands_sep) {
  buffer += num_digits;
  Char *end = buffer;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    unsigned index = static_cast<unsigned>((value % 100) * 2);
    value /= 100;
    *--buffer = data::DIGITS[index + 1];
    thousands_sep(buffer);
    *--buffer = data::DIGITS[index];
    thousands_sep(buffer);
  }
  if (value < 10) {
    *--buffer = static_cast<char>('0' + value);
    return end;
  }
  unsigned index = static_cast<unsigned>(value * 2);
  *--buffer = data::DIGITS[index + 1];
  thousands_sep(buffer);
  *--buffer = data::DIGITS[index];
  return end;
}